

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.cpp
# Opt level: O1

void __thiscall embree::SceneGraph::GroupNode::calculateStatistics(GroupNode *this,Statistics *stat)

{
  size_t sVar1;
  pointer pRVar2;
  Ref<embree::SceneGraph::Node> *c;
  pointer pRVar3;
  
  sVar1 = (this->super_Node).indegree;
  (this->super_Node).indegree = sVar1 + 1;
  if (sVar1 != 0) {
    return;
  }
  pRVar2 = (this->children).
           super__Vector_base<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pRVar3 = (this->children).
                super__Vector_base<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pRVar3 != pRVar2; pRVar3 = pRVar3 + 1) {
    (*(pRVar3->ptr->super_RefCount)._vptr_RefCount[9])(pRVar3->ptr,stat);
  }
  return;
}

Assistant:

void SceneGraph::GroupNode::calculateStatistics(Statistics& stat)
  {
    indegree++;
    if (indegree == 1) {
      for (auto&  c : children)
        c->calculateStatistics(stat);
    }
  }